

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O1

void __thiscall cmCTestLaunchReporter::cmCTestLaunchReporter(cmCTestLaunchReporter *this)

{
  _Rb_tree_header *p_Var1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *this_00;
  long *local_50 [2];
  long local_40 [2];
  
  (this->OptionOutput)._M_dataplus._M_p = (pointer)&(this->OptionOutput).field_2;
  (this->OptionOutput)._M_string_length = 0;
  (this->OptionOutput).field_2._M_local_buf[0] = '\0';
  (this->OptionSource)._M_dataplus._M_p = (pointer)&(this->OptionSource).field_2;
  (this->OptionSource)._M_string_length = 0;
  (this->OptionSource).field_2._M_local_buf[0] = '\0';
  (this->OptionLanguage)._M_dataplus._M_p = (pointer)&(this->OptionLanguage).field_2;
  (this->OptionLanguage)._M_string_length = 0;
  (this->OptionLanguage).field_2._M_local_buf[0] = '\0';
  (this->OptionTargetName)._M_dataplus._M_p = (pointer)&(this->OptionTargetName).field_2;
  (this->OptionTargetName)._M_string_length = 0;
  (this->OptionTargetName).field_2._M_local_buf[0] = '\0';
  (this->OptionTargetType)._M_dataplus._M_p = (pointer)&(this->OptionTargetType).field_2;
  (this->OptionTargetType)._M_string_length = 0;
  (this->OptionTargetType).field_2._M_local_buf[0] = '\0';
  (this->OptionBuildDir)._M_dataplus._M_p = (pointer)&(this->OptionBuildDir).field_2;
  (this->OptionBuildDir)._M_string_length = 0;
  (this->OptionBuildDir).field_2._M_local_buf[0] = '\0';
  (this->OptionFilterPrefix)._M_dataplus._M_p = (pointer)&(this->OptionFilterPrefix).field_2;
  (this->OptionFilterPrefix)._M_string_length = 0;
  (this->OptionFilterPrefix).field_2._M_local_buf[0] = '\0';
  (this->CWD)._M_dataplus._M_p = (pointer)&(this->CWD).field_2;
  (this->CWD)._M_string_length = 0;
  (this->CWD).field_2._M_local_buf[0] = '\0';
  (this->RealArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->RealArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RealArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LogHash)._M_dataplus._M_p = (pointer)&(this->LogHash).field_2;
  (this->LogHash)._M_string_length = 0;
  (this->LogHash).field_2._M_local_buf[0] = '\0';
  (this->LogDir)._M_dataplus._M_p = (pointer)&(this->LogDir).field_2;
  (this->LogDir)._M_string_length = 0;
  (this->LogDir).field_2._M_local_buf[0] = '\0';
  (this->LogOut)._M_dataplus._M_p = (pointer)&(this->LogOut).field_2;
  (this->LogOut)._M_string_length = 0;
  (this->LogOut).field_2._M_local_buf[0] = '\0';
  (this->LogErr)._M_dataplus._M_p = (pointer)&(this->LogErr).field_2;
  (this->LogErr)._M_string_length = 0;
  (this->LogErr).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->Labels)._M_t._M_impl.super__Rb_tree_header;
  (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->RegexWarningSuppress).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->RegexWarningSuppress).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RegexWarningSuppress).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RegexWarning).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RegexWarning).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RegexWarning).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceDir)._M_dataplus._M_p = (pointer)&(this->SourceDir).field_2;
  (this->SourceDir)._M_string_length = 0;
  (this->SourceDir).field_2._M_local_buf[0] = '\0';
  this->Passthru = true;
  this->ExitCode = 1;
  this_00 = &this->RegexWarning;
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->CWD,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  ComputeFileNames(this);
  std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
  emplace_back<char_const(&)[37]>
            ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)this_00,
             (char (*) [37])"(^|[ :])[Ww][Aa][Rr][Nn][Ii][Nn][Gg]");
  std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
  emplace_back<char_const(&)[33]>
            ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)this_00,
             (char (*) [33])"(^|[ :])[Rr][Ee][Mm][Aa][Rr][Kk]");
  std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
  emplace_back<char_const(&)[25]>
            ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)this_00,
             (char (*) [25])"(^|[ :])[Nn][Oo][Tt][Ee]");
  return;
}

Assistant:

cmCTestLaunchReporter::cmCTestLaunchReporter()
{
  this->Passthru = true;
  this->ExitCode = 1;
  this->CWD = cmSystemTools::GetCurrentWorkingDirectory();

  this->ComputeFileNames();

  // Common compiler warning formats.  These are much simpler than the
  // full log-scraping expressions because we do not need to extract
  // file and line information.
  this->RegexWarning.emplace_back("(^|[ :])[Ww][Aa][Rr][Nn][Ii][Nn][Gg]");
  this->RegexWarning.emplace_back("(^|[ :])[Rr][Ee][Mm][Aa][Rr][Kk]");
  this->RegexWarning.emplace_back("(^|[ :])[Nn][Oo][Tt][Ee]");
}